

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O3

void __thiscall
SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test::
~SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test
          (SemanticAnalyserTest_UndeclaredFunctionCallInReturnThrows_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredFunctionCallInReturnThrows)
{
  std::string source = R"SRC(
  fn f(): f32 { ret test(); }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  throwTest(source);
}